

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O0

bool Memory::HeapBlockList::
     Contains<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
               (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *block,
               SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list,
               SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail)

{
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *local_30;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail_local;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list_local;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *block_local;
  
  local_30 = list;
  while( true ) {
    if (local_30 == tail) {
      return false;
    }
    if (local_30 == block) break;
    local_30 = SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                         (local_30);
  }
  return true;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }